

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

bool __thiscall cmCPackGenerator::IsSetToOff(cmCPackGenerator *this,string *op)

{
  string_view val;
  bool bVar1;
  string *this_00;
  cmValue local_28;
  cmValue ret;
  string *op_local;
  cmCPackGenerator *this_local;
  
  ret.Value = op;
  local_28 = cmMakefile::GetDefinition(this->MakefileMap,op);
  bVar1 = cmNonempty(local_28);
  if (bVar1) {
    this_00 = cmValue::operator*[abi_cxx11_(&local_28);
    val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    this_local._7_1_ = cmIsOff(val);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCPackGenerator::IsSetToOff(const std::string& op) const
{
  cmValue ret = this->MakefileMap->GetDefinition(op);
  if (cmNonempty(ret)) {
    return cmIsOff(*ret);
  }
  return false;
}